

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::disableIncompatibleEncryption(QPDFWriter *this,int major,int minor,int extension_level)

{
  int iVar1;
  element_type *peVar2;
  char *pcVar3;
  allocator<char> local_81;
  key_type local_80;
  int local_60;
  int R;
  allocator<char> local_49;
  key_type local_48;
  int local_24;
  byte local_1d;
  int V;
  int iStack_18;
  bool disable;
  int extension_level_local;
  int minor_local;
  int major_local;
  QPDFWriter *this_local;
  
  V = extension_level;
  iStack_18 = minor;
  extension_level_local = major;
  _minor_local = this;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->encrypted & 1U) != 0) {
    local_1d = 0;
    iVar1 = compareVersions(this,extension_level_local,iStack_18,1,3);
    if (iVar1 < 0) {
      local_1d = 1;
    }
    else {
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/V",&local_49);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&peVar2->encryption_dictionary,&local_48);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = QUtil::string_to_int(pcVar3);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      local_24 = iVar1;
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"/R",&local_81);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&peVar2->encryption_dictionary,&local_80);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = QUtil::string_to_int(pcVar3);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      local_60 = iVar1;
      iVar1 = compareVersions(this,extension_level_local,iStack_18,1,4);
      if (iVar1 < 0) {
        if ((1 < local_24) || (2 < local_60)) {
          local_1d = 1;
        }
      }
      else {
        iVar1 = compareVersions(this,extension_level_local,iStack_18,1,5);
        if (iVar1 < 0) {
          if ((2 < local_24) || (3 < local_60)) {
            local_1d = 1;
          }
        }
        else {
          iVar1 = compareVersions(this,extension_level_local,iStack_18,1,6);
          if (iVar1 < 0) {
            peVar2 = std::
                     __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            if ((peVar2->encrypt_use_aes & 1U) != 0) {
              local_1d = 1;
            }
          }
          else {
            iVar1 = compareVersions(this,extension_level_local,iStack_18,1,7);
            if (((iVar1 < 0) ||
                ((iVar1 = compareVersions(this,extension_level_local,iStack_18,1,7), iVar1 == 0 &&
                 (V < 3)))) && ((4 < local_24 || (4 < local_60)))) {
              local_1d = 1;
            }
          }
        }
      }
    }
    if ((local_1d & 1) != 0) {
      QTC::TC("qpdf","QPDFWriter forced version disabled encryption",0);
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      peVar2->encrypted = false;
    }
  }
  return;
}

Assistant:

void
QPDFWriter::disableIncompatibleEncryption(int major, int minor, int extension_level)
{
    if (!m->encrypted) {
        return;
    }

    bool disable = false;
    if (compareVersions(major, minor, 1, 3) < 0) {
        disable = true;
    } else {
        int V = QUtil::string_to_int(m->encryption_dictionary["/V"].c_str());
        int R = QUtil::string_to_int(m->encryption_dictionary["/R"].c_str());
        if (compareVersions(major, minor, 1, 4) < 0) {
            if ((V > 1) || (R > 2)) {
                disable = true;
            }
        } else if (compareVersions(major, minor, 1, 5) < 0) {
            if ((V > 2) || (R > 3)) {
                disable = true;
            }
        } else if (compareVersions(major, minor, 1, 6) < 0) {
            if (m->encrypt_use_aes) {
                disable = true;
            }
        } else if (
            (compareVersions(major, minor, 1, 7) < 0) ||
            ((compareVersions(major, minor, 1, 7) == 0) && extension_level < 3)) {
            if ((V >= 5) || (R >= 5)) {
                disable = true;
            }
        }
    }
    if (disable) {
        QTC::TC("qpdf", "QPDFWriter forced version disabled encryption");
        m->encrypted = false;
    }
}